

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O1

PHYSFS_EnumerateCallbackResult
DIR_enumerate(void *opaque,char *dname,PHYSFS_EnumerateCallback cb,char *origdir,void *callbackdata)

{
  void *callbackdata_00;
  PHYSFS_EnumerateCallbackResult PVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *dirname;
  ulong len;
  undefined1 *puVar5;
  undefined1 *ptr;
  undefined1 auStack_48 [8];
  void *local_40;
  char *local_38;
  
  puVar5 = auStack_48;
  local_40 = callbackdata;
  local_38 = origdir;
  if (opaque == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen((char *)opaque);
  }
  sVar3 = strlen(dname);
  len = sVar3 + sVar2 + 1;
  if (len < 0x100) {
    puVar5 = auStack_48 + -(sVar3 + sVar2 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar5;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar5 + -8) = 0x10cba5;
  pcVar4 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)(puVar5 + -8) = 0x10cbb6;
  dirname = cvtToDependent((char *)opaque,dname,pcVar4,len);
  pcVar4 = local_38;
  callbackdata_00 = local_40;
  if (dirname == (char *)0x0) {
    PVar1 = PHYSFS_ENUM_ERROR;
  }
  else {
    *(undefined8 *)(puVar5 + -8) = 0x10cbd1;
    PVar1 = __PHYSFS_platformEnumerate(dirname,cb,pcVar4,callbackdata_00);
    *(undefined8 *)(puVar5 + -8) = 0x10cbdc;
    __PHYSFS_smallFree(dirname);
  }
  return PVar1;
}

Assistant:

static PHYSFS_EnumerateCallbackResult DIR_enumerate(void *opaque,
                         const char *dname, PHYSFS_EnumerateCallback cb,
                         const char *origdir, void *callbackdata)
{
    char *d;
    PHYSFS_EnumerateCallbackResult retval;
    CVT_TO_DEPENDENT(d, opaque, dname);
    BAIL_IF_ERRPASS(!d, PHYSFS_ENUM_ERROR);
    retval = __PHYSFS_platformEnumerate(d, cb, origdir, callbackdata);
    __PHYSFS_smallFree(d);
    return retval;
}